

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gui.test.cpp
# Opt level: O1

int main(void)

{
  ulong uVar1;
  size_t __i;
  long lVar2;
  ulong uVar3;
  int i;
  uint uVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  mt19937 mersenneRand;
  Vector3f local_13d8;
  float local_13c8;
  float local_13b8;
  undefined1 local_13a0 [4];
  float fStack_139c;
  float afStack_1398 [1246];
  size_t local_20;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\ntestRgbToHsv()\n",0x10);
  uVar3 = 0;
  do {
    iVar5 = (int)uVar3;
    local_13a0 = (undefined1  [4])((float)((int)(uVar3 / 0x24) + (int)(uVar3 / 0xd8) * -6) / 5.0);
    auVar10._4_4_ = iVar5;
    auVar10._0_4_ = iVar5;
    auVar10._8_4_ = iVar5;
    auVar10._12_4_ = iVar5;
    auVar7._0_12_ = ZEXT812(0);
    uVar1 = (auVar10._8_8_ & 0xffffffff) / 6;
    auVar7._12_4_ = (undefined4)uVar1;
    auVar6._0_4_ = (float)((int)(uVar3 / 6) + (int)((uVar3 / 6) / 6) * -6);
    auVar6._4_4_ = (float)(iVar5 + (int)(uVar3 / 6) * -6);
    auVar6._8_4_ = (float)-(int)((auVar7._8_8_ & 0xffffffff) * 6);
    auVar6._12_4_ = (float)-(int)(uVar1 * 6);
    auVar7 = divps(auVar6,_DAT_00103070);
    fStack_139c = auVar7._0_4_;
    afStack_1398[0] = auVar7._4_4_;
    testRgbToHsv((Vector3f *)local_13a0);
    uVar3 = (ulong)(iVar5 + 1U);
  } while (iVar5 + 1U != 0xd8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\ntestHsvToRgb()\n",0x10);
  uVar4 = 0;
  do {
    local_13a0 = (undefined1  [4])((float)(int)(uVar4 / 0x24 + (uVar4 / 0xd8) * -6) / 5.0);
    auVar11._4_4_ = uVar4;
    auVar11._0_4_ = uVar4;
    auVar11._8_4_ = uVar4;
    auVar11._12_4_ = uVar4;
    auVar8._0_12_ = ZEXT812(0);
    uVar3 = (auVar11._8_8_ & 0xffffffff) / 6;
    auVar8._12_4_ = (undefined4)uVar3;
    auVar9._0_4_ = (float)((uVar4 / 6) % 6);
    auVar9._4_4_ = (float)(uVar4 % 6);
    auVar9._8_4_ = (float)-(int)((auVar8._8_8_ & 0xffffffff) * 6);
    auVar9._12_4_ = (float)-(int)(uVar3 * 6);
    auVar7 = divps(auVar9,_DAT_00103070);
    fStack_139c = auVar7._0_4_;
    afStack_1398[0] = auVar7._4_4_;
    testHsvToRgb((Vector3f *)local_13a0);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0xd8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\ntest random samples\n",0x15);
  lVar2 = 1;
  uVar3 = 0x1571;
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2);
    *(ulong *)(local_13a0 + lVar2 * 8) = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  local_13a0 = (undefined1  [4])0x7b;
  fStack_139c = 0.0;
  lVar2 = 1;
  uVar3 = 0x7b;
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2);
    *(ulong *)(local_13a0 + lVar2 * 8) = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  local_20 = 0x270;
  iVar5 = 100;
  do {
    local_13b8 = std::
                 generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                           ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)local_13a0);
    local_13c8 = std::
                 generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                           ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)local_13a0);
    local_13d8.z = std::
                   generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                             ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                               *)local_13a0);
    local_13d8.z = local_13d8.z + 0.0;
    local_13d8.x = local_13b8 + 0.0;
    local_13d8.y = local_13c8 + 0.0;
    testRgbToHsv(&local_13d8);
    local_13b8 = std::
                 generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                           ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)local_13a0);
    local_13c8 = std::
                 generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                           ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)local_13a0);
    local_13d8.z = std::
                   generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                             ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                               *)local_13a0);
    local_13d8.z = local_13d8.z + 0.0;
    local_13d8.x = local_13b8 + 0.0;
    local_13d8.y = local_13c8 + 0.0;
    testHsvToRgb(&local_13d8);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return 0;
}

Assistant:

int main() {
    constexpr int states = 6, states2 = states * states, states3 = states2 * states;
    std::cout << "\ntestRgbToHsv()\n";
    for (int i = 0; i < states3; ++i) {
        testRgbToHsv({
            static_cast<float>(i / states2 % states) / (states - 1),
            static_cast<float>(i / states % states) / (states - 1),
            static_cast<float>(i % states) / (states - 1)
        });
    }
    std::cout << "\ntestHsvToRgb()\n";
    for (int i = 0; i < states3; ++i) {
        testHsvToRgb({
            static_cast<float>(i / states2 % states) / (states - 1),
            static_cast<float>(i / states % states) / (states - 1),
            static_cast<float>(i % states) / (states - 1)
        });
    }
    std::cout << "\ntest random samples\n";
    std::mt19937 mersenneRand;
    mersenneRand.seed(123);
    std::uniform_real_distribution<float> dist(0.0f, 1.0f);
    for (int i = 0; i < 100; ++i) {
        testRgbToHsv({dist(mersenneRand), dist(mersenneRand), dist(mersenneRand)});
        testHsvToRgb({dist(mersenneRand), dist(mersenneRand), dist(mersenneRand)});
    }

    return 0;
}